

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int ARKodeSetMaxNumConstrFails(void *arkode_mem,int maxfails)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x5d4;
  }
  else {
    if (*(int *)((long)arkode_mem + 0xf0) != 0) {
      if (maxfails < 1) {
        *(undefined4 *)((long)arkode_mem + 0x2fc) = 10;
      }
      else {
        *(int *)((long)arkode_mem + 0x2fc) = maxfails;
      }
      return 0;
    }
    msgfmt = "time-stepping module does not support temporal adaptivity";
    iVar1 = -0x30;
    error_code = -0x30;
    line = 0x5dd;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeSetMaxNumConstrFails",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int ARKodeSetMaxNumConstrFails(void* arkode_mem, int maxfails)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* Passing maxfails = 0 sets the default, otherwise set to input */
  if (maxfails <= 0) { ark_mem->maxconstrfails = MAXCONSTRFAILS; }
  else { ark_mem->maxconstrfails = maxfails; }

  return (ARK_SUCCESS);
}